

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_encoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialIntegerAttributeEncoder::Init
          (SequentialIntegerAttributeEncoder *this,PointCloudEncoder *encoder,int attribute_id)

{
  PredictionSchemeTypedEncoderInterface<int,_int> *pPVar1;
  bool bVar2;
  int iVar3;
  PredictionSchemeMethod PVar4;
  _Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false> _Var5;
  _Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false> local_20;
  
  bVar2 = SequentialAttributeEncoder::Init
                    (&this->super_SequentialAttributeEncoder,encoder,attribute_id);
  if ((!bVar2) ||
     ((iVar3 = (*(this->super_SequentialAttributeEncoder)._vptr_SequentialAttributeEncoder[8])(this)
      , (char)iVar3 == '\x01' &&
      (5 < (((this->super_SequentialAttributeEncoder).attribute_)->super_GeometryAttribute).
           data_type_ - DT_INT8)))) {
    return false;
  }
  PVar4 = GetPredictionMethodFromOptions(attribute_id,encoder->options_);
  (*(this->super_SequentialAttributeEncoder)._vptr_SequentialAttributeEncoder[0xc])
            (&local_20,this,(ulong)(uint)PVar4);
  _Var5._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0;
  pPVar1 = (this->prediction_scheme_)._M_t.
           super___uniq_ptr_impl<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
           .super__Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false>.
           _M_head_impl;
  (this->prediction_scheme_)._M_t.
  super___uniq_ptr_impl<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
  .super__Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  if (pPVar1 != (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0) {
    (**(code **)((long)(pPVar1->super_PredictionSchemeEncoderInterface).
                       super_PredictionSchemeInterface + 8))();
    if (local_20._M_head_impl != (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0) {
      (*((local_20._M_head_impl)->super_PredictionSchemeEncoderInterface).
        super_PredictionSchemeInterface._vptr_PredictionSchemeInterface[1])();
    }
    _Var5._M_head_impl =
         (this->prediction_scheme_)._M_t.
         super___uniq_ptr_impl<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
         .super__Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false>.
         _M_head_impl;
  }
  if (_Var5._M_head_impl == (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0) {
    return true;
  }
  iVar3 = (*(this->super_SequentialAttributeEncoder)._vptr_SequentialAttributeEncoder[9])(this);
  if ((char)iVar3 != '\0') {
    return true;
  }
  pPVar1 = (this->prediction_scheme_)._M_t.
           super___uniq_ptr_impl<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
           .super__Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false>.
           _M_head_impl;
  (this->prediction_scheme_)._M_t.
  super___uniq_ptr_impl<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
  .super__Head_base<0UL,_draco::PredictionSchemeTypedEncoderInterface<int,_int>_*,_false>.
  _M_head_impl = (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0;
  if (pPVar1 == (PredictionSchemeTypedEncoderInterface<int,_int> *)0x0) {
    return true;
  }
  (**(code **)((long)(pPVar1->super_PredictionSchemeEncoderInterface).
                     super_PredictionSchemeInterface + 8))();
  return true;
}

Assistant:

bool SequentialIntegerAttributeEncoder::Init(PointCloudEncoder *encoder,
                                             int attribute_id) {
  if (!SequentialAttributeEncoder::Init(encoder, attribute_id)) {
    return false;
  }
  if (GetUniqueId() == SEQUENTIAL_ATTRIBUTE_ENCODER_INTEGER) {
    // When encoding integers, this encoder currently works only for integer
    // attributes up to 32 bits.
    switch (attribute()->data_type()) {
      case DT_INT8:
      case DT_UINT8:
      case DT_INT16:
      case DT_UINT16:
      case DT_INT32:
      case DT_UINT32:
        break;
      default:
        return false;
    }
  }
  // Init prediction scheme.
  const PredictionSchemeMethod prediction_scheme_method =
      GetPredictionMethodFromOptions(attribute_id, *encoder->options());

  prediction_scheme_ = CreateIntPredictionScheme(prediction_scheme_method);

  if (prediction_scheme_ && !InitPredictionScheme(prediction_scheme_.get())) {
    prediction_scheme_ = nullptr;
  }

  return true;
}